

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

FoundationPileCollider * __thiscall
solitaire::Context::getFoundationPileCollider(Context *this,PileId *id)

{
  bool bVar1;
  runtime_error *this_00;
  uint *puVar2;
  const_reference this_01;
  type pFVar3;
  PileId *id_local;
  Context *this_local;
  
  bVar1 = boost::operators_impl::operator>=(id,&interfaces::Solitaire::foundationPilesCount);
  if (!bVar1) {
    puVar2 = piles::PileId::operator_cast_to_unsigned_int_(id);
    this_01 = std::
              array<std::unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>,_4UL>
              ::operator[](&this->foundationPileColliders,(ulong)*puVar2);
    pFVar3 = std::
             unique_ptr<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
             ::operator*(this_01);
    return pFVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  puVar2 = piles::PileId::operator_cast_to_unsigned_int_(id);
  std::runtime_error::runtime_error(this_00,"Invalid foundation pile id: " + *puVar2);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const FoundationPileCollider& Context::getFoundationPileCollider(const PileId id) const {
    if (id >= Solitaire::foundationPilesCount)
        throw std::runtime_error {"Invalid foundation pile id: " + id};
    return *foundationPileColliders[id];
}